

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall kj::HttpServer::listenLoop(HttpServer *this,ConnectionReceiver *port)

{
  PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *__return_storage_ptr__;
  PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_01;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> handle;
  undefined8 in_RDX;
  kj *this_02;
  anon_class_16_2_55776b59 local_50;
  undefined8 local_40;
  PromiseBase local_38;
  
  handle._M_fr_ptr = operator_new(0x430);
  *(code **)handle._M_fr_ptr = listenLoop;
  *(code **)((long)handle._M_fr_ptr + 8) = listenLoop;
  *(undefined8 *)((long)handle._M_fr_ptr + 0x420) = in_RDX;
  *(ConnectionReceiver **)((long)handle._M_fr_ptr + 0x418) = port;
  local_50.this = (HttpServer *)0x4d3fd6;
  local_50.connection = (Own<kj::AsyncIoStream,_std::nullptr_t> *)0x4d48c6;
  local_40 = 0x1f00001fdd;
  location.function = "listenLoop";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1fdd;
  location.columnNumber = 0x1f;
  kj::_::Coroutine<void>::Coroutine
            ((Coroutine<void> *)((long)handle._M_fr_ptr + 0x10),handle,location);
  local_38.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
       ((long)handle._M_fr_ptr + 0x238);
  this_00 = (PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
            ((long)handle._M_fr_ptr + 0x3f8);
  this_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x408);
  this_02 = (kj *)((long)handle._M_fr_ptr + 0x410);
  while( true ) {
    (**(code **)**(undefined8 **)((long)handle._M_fr_ptr + 0x420))(this_01);
    co_await<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
              (__return_storage_ptr__,
               (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)this_01);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x428) = 0;
    bVar1 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,
                       (CoroutineBase *)((long)handle._M_fr_ptr + 0x10));
    if (bVar1) break;
    kj::_::PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::await_resume(this_00);
    kj::_::PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~PromiseAwaiter
              (__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_01);
    local_50.this = *(HttpServer **)((long)handle._M_fr_ptr + 0x418);
    local_50.connection = (Own<kj::AsyncIoStream,_std::nullptr_t> *)this_00;
    evalNow<kj::HttpServer::listenLoop(kj::ConnectionReceiver&)::__0>(this_02,&local_50);
    TaskSet::add((TaskSet *)(*(long *)((long)handle._M_fr_ptr + 0x418) + 0xb0),
                 (Promise<void> *)this_02);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_02);
    Own<kj::AsyncIoStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncIoStream,_std::nullptr_t> *)this_00);
  }
  return (Promise<void>)(PromiseNode *)local_38.node.ptr;
}

Assistant:

kj::Promise<void> HttpServer::listenLoop(kj::ConnectionReceiver& port) {
  for (;;) {
    auto connection = co_await port.accept();
    tasks.add(kj::evalNow([&]() { return listenHttp(kj::mv(connection)); }));
  }
}